

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall
SModeIRCCommand::trigger
          (SModeIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  IRC_Bot *pIVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  string local_148;
  __sv_type local_128;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  reference local_f8;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  uint smodes;
  PlayerInfo *player;
  size_t local_b8;
  char *local_b0;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_90 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_78;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  char *local_68;
  long local_60;
  Channel *chan;
  char *local_50;
  SModeIRCCommand *local_48;
  size_t local_40;
  IRC_Bot *local_38;
  IRC_Bot *source_local;
  SModeIRCCommand *this_local;
  string_view nick_local;
  string_view channel_local;
  
  nick_local._M_len = (size_t)nick._M_str;
  this_local = (SModeIRCCommand *)nick._M_len;
  pcVar5 = channel._M_str;
  nick_local._M_str = (char *)channel._M_len;
  local_38 = source;
  source_local = (IRC_Bot *)this;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&parameters);
  pIVar1 = local_38;
  if (bVar3) {
    local_48 = this_local;
    local_40 = nick_local._M_len;
    _chan = sv("Error: Too Few Parameters. Syntax: smode <Player>",0x31);
    Jupiter::IRC::Client::sendNotice(pIVar1,local_48,local_40,chan,local_50);
  }
  else {
    servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)nick_local._M_str;
    local_68 = pcVar5;
    local_60 = Jupiter::IRC::Client::getChannel(local_38,nick_local._M_str,pcVar5);
    if (local_60 != 0) {
      RenX::getCore();
      Jupiter::IRC::Client::Channel::getType();
      RenX::Core::getServers((int)local_90);
      local_78 = local_90;
      bVar3 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_78);
      pcVar2 = nick_local._M_str;
      pIVar1 = local_38;
      this_00 = local_78;
      if (bVar3) {
        bVar6 = sv("Error: Channel not attached to any connected Renegade X servers.",0x40);
        local_b8 = bVar6._M_len;
        local_b0 = bVar6._M_str;
        Jupiter::IRC::Client::sendMessage(pIVar1,pcVar2,pcVar5,local_b8,local_b0);
      }
      else {
        __range1._4_4_ = 0;
        __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_78);
        server = (Server **)
                 std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
        while (bVar3 = __gnu_cxx::
                       operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                 (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                           *)&server), pIVar1 = local_38, ((bVar3 ^ 0xffU) & 1) != 0
              ) {
          local_f8 = __gnu_cxx::
                     __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                     ::operator*(&__end1);
          if (*local_f8 != (Server *)0x0) {
            local_108 = (undefined4)parameters._M_len;
            uStack_104 = parameters._M_len._4_4_;
            uStack_100 = parameters._M_str._0_4_;
            uStack_fc = parameters._M_str._4_4_;
            lVar4 = RenX::Server::getPlayerByPartName(*local_f8,parameters._M_len,parameters._M_str)
            ;
            if (lVar4 != 0) {
              RenX::Server::smodePlayer((PlayerInfo *)*local_f8);
              __range1._4_4_ = __range1._4_4_ + 1;
            }
          }
          __gnu_cxx::
          __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
          ::operator++(&__end1);
        }
        channel_local._M_len._0_4_ = channel._M_str._0_4_;
        channel_local._M_len._4_4_ = channel._M_str._4_4_;
        local_118 = nick_local._M_str._0_4_;
        uStack_114 = nick_local._M_str._4_4_;
        uStack_110 = (undefined4)channel_local._M_len;
        uStack_10c = channel_local._M_len._4_4_;
        string_printf_abi_cxx11_(&local_148,"%u players smoded.",(ulong)__range1._4_4_);
        local_128 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_148);
        Jupiter::IRC::Client::sendMessage
                  (pIVar1,CONCAT44(uStack_114,local_118),CONCAT44(uStack_10c,uStack_110),
                   local_128._M_len,local_128._M_str);
        std::__cxx11::string::~string((string *)&local_148);
      }
      std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_90);
    }
  }
  return;
}

Assistant:

void SModeIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendNotice(nick, "Error: Too Few Parameters. Syntax: smode <Player>"sv);
		return;
	}

	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan == nullptr) {
		return;
	}

	const auto& servers = RenX::getCore()->getServers(chan->getType());
	if (servers.empty()) {
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
		return;
	}

	RenX::PlayerInfo *player;
	unsigned int smodes = 0;
	for (const auto& server : servers) {
		if (server != nullptr) {
			player = server->getPlayerByPartName(parameters);
			if (player != nullptr) {
				server->smodePlayer(*player);
				++smodes;
			}
		}
	}
	source->sendMessage(channel, string_printf("%u players smoded.", smodes));
}